

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::reporters::Reporter_testInMemoryReporter_Test::TestBody
          (Reporter_testInMemoryReporter_Test *this)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int local_88 [2];
  int local_80 [2];
  AssertionResult gtest_ar;
  int kNumReports;
  InMemoryReporter reporter;
  
  InMemoryReporter::InMemoryReporter(&reporter);
  kNumReports = 100;
  iVar1 = 100;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    InMemoryReporter::report(&reporter,(Span *)(anonymous_namespace)::span);
  }
  local_88[0] = InMemoryReporter::spansSubmitted(&reporter);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"kNumReports","reporter.spansSubmitted()",&kNumReports,local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/reporters/ReporterTest.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_88);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    InMemoryReporter::reset(&reporter);
    local_88[0] = 0;
    local_80[0] = InMemoryReporter::spansSubmitted(&reporter);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0","reporter.spansSubmitted()",local_88,local_80);
    if (gtest_ar.success_ != false) goto LAB_001cbc59;
    testing::Message::Message((Message *)local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/reporters/ReporterTest.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_88);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_88);
LAB_001cbc59:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  InMemoryReporter::~InMemoryReporter(&reporter);
  return;
}

Assistant:

TEST(Reporter, testInMemoryReporter)
{
    InMemoryReporter reporter;
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
    }
    ASSERT_EQ(kNumReports, reporter.spansSubmitted());
    reporter.reset();
    ASSERT_EQ(0, reporter.spansSubmitted());
    reporter.close();
}